

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

int Unm_ManPrintPairStats(Hash_IntMan_t *pHash,int nTotal0,int nPairs0,int nPairs1,int fUseLit)

{
  int iVar1;
  Hash_IntObj_t *pHVar2;
  int i;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  int Counter [21];
  
  Counter[0x10] = 0;
  Counter[0x11] = 0;
  Counter[0x12] = 0;
  Counter[0x13] = 0;
  Counter[0xc] = 0;
  Counter[0xd] = 0;
  Counter[0xe] = 0;
  Counter[0xf] = 0;
  Counter[8] = 0;
  Counter[9] = 0;
  Counter[10] = 0;
  Counter[0xb] = 0;
  Counter[4] = 0;
  Counter[5] = 0;
  Counter[6] = 0;
  Counter[7] = 0;
  Counter[0x14] = 0;
  Counter[0] = 0;
  Counter[1] = 0;
  Counter[2] = 0;
  Counter[3] = 0;
  iVar5 = pHash->vObjs->nSize;
  uVar7 = 0;
  iVar4 = 0;
  for (i = 1; i < iVar5 / 4; i = i + 1) {
    pHVar2 = Hash_IntObj(pHash,i);
    iVar1 = pHVar2->iData2;
    iVar6 = iVar1;
    if (0x13 < iVar1) {
      iVar6 = 0x14;
    }
    iVar4 = iVar4 + iVar6;
    Counter[iVar6] = Counter[iVar6] + 1;
    uVar7 = uVar7 + (1 < iVar1);
  }
  puts("Statistics for pairs appearing less than 20 times:");
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  for (uVar3 = 0; uVar3 != 0x15; uVar3 = uVar3 + 1) {
    if (0 < Counter[uVar3]) {
      printf("%3d : %7d  %7.2f %%\n",
             ((double)(int)uVar3 * (double)Counter[uVar3] * 100.0) / (double)iVar4,
             uVar3 & 0xffffffff);
    }
  }
  iVar5 = 1;
  if (1 < nTotal0) {
    iVar5 = nTotal0;
  }
  dVar8 = (double)iVar5;
  printf("Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n"
         ,((double)nPairs0 * 100.0) / dVar8,((double)(int)uVar7 * 100.0) / dVar8,
         ((double)nPairs1 * 100.0) / dVar8,(ulong)(uint)nTotal0,(ulong)(uint)nPairs0,(ulong)uVar7);
  return uVar7;
}

Assistant:

int Unm_ManPrintPairStats( Hash_IntMan_t * pHash, int nTotal0, int nPairs0, int nPairs1, int fUseLit )
{
    int i, Num, nRefs, nPairs = 0, nTotal = 0, Counter[21] = {0};
    Num = Hash_IntManEntryNum( pHash );
    for ( i = 1; i <= Num; i++ )
    {
        nRefs = Abc_MinInt( 20, Hash_IntObjData2(pHash, i) );
        nTotal += nRefs;
        Counter[nRefs]++;
        nPairs += (nRefs > 1);
/*
        if ( fUseLit )
            printf( "(%c%c, %c%c) %d\n", 
                Abc_LitIsCompl(Hash_IntObjData0(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData0(pHash, i)-2), 
                Abc_LitIsCompl(Hash_IntObjData1(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData1(pHash, i)-2), nRefs );
        else
            printf( "( %c,  %c) %d\n", 
                'a' + Hash_IntObjData0(pHash, i)-1, 
                'a' + Hash_IntObjData1(pHash, i)-1, nRefs );
*/
//        printf( "(%4d, %4d) %d\n", Hash_IntObjData0(pHash, i), Hash_IntObjData1(pHash, i), nRefs );

    }
    printf( "Statistics for pairs appearing less than 20 times:\n" );
    for ( i = 0; i < 21; i++ )
        if ( Counter[i] > 0 )
            printf( "%3d : %7d  %7.2f %%\n", i, Counter[i], 100.0 * Counter[i] * i / Abc_MaxInt(nTotal, 1) );
    printf( "Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n", nTotal0, 
        nPairs0,  100.0 * nPairs0 / Abc_MaxInt(nTotal0, 1), 
        nPairs, 100.0 * nPairs / Abc_MaxInt(nTotal0, 1), 
        nPairs1, 100.0 * nPairs1 / Abc_MaxInt(nTotal0, 1) );
    return nPairs;
}